

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O1

bool QTest::qWaitForWindowExposed(QWidget *widget,int timeout)

{
  char cVar1;
  QWidget *pQVar2;
  QWindow *pQVar3;
  QWindow *pQVar4;
  ulong uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QDeadlineTimer local_58;
  long local_48;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidget::window(widget);
  pQVar3 = QWidget::windowHandle(pQVar2);
  if (pQVar3 == (QWindow *)0x0) {
    bVar6 = false;
  }
  else {
    QDeadlineTimer::QDeadlineTimer(&local_58,(long)timeout,PreciseTimer);
    local_48 = local_58.t1;
    uStack_40 = local_58.t2;
    uStack_3c = local_58.type;
    pQVar2 = QWidget::window(widget);
    pQVar4 = QWidget::windowHandle(pQVar2);
    pQVar3 = pQVar4;
    if (pQVar4 != (QWindow *)0x0) {
      pQVar3 = (QWindow *)QWindow::isExposed();
    }
    bVar6 = true;
    if ((pQVar4 != (QWindow *)0x0 & (byte)pQVar3) == 0) {
      do {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        pQVar2 = QWidget::window(widget);
        pQVar4 = QWidget::windowHandle(pQVar2);
        pQVar3 = pQVar4;
        if (pQVar4 != (QWindow *)0x0) {
          pQVar3 = (QWindow *)QWindow::isExposed();
        }
        if ((pQVar4 != (QWindow *)0x0 & (byte)pQVar3) != 0) goto LAB_002f4fd3;
        uVar5 = 0x7fffffffffffffff;
        if ((local_48 != 0x7fffffffffffffff) &&
           (uVar5 = QDeadlineTimer::rawRemainingTimeNSecs(), (long)uVar5 < 1)) {
          uVar5 = 0;
        }
        if (uVar5 != 0) {
          uVar5 = uVar5 / 1000000 + (ulong)((uVar5 / 1000000) * 1000000 < uVar5);
          if (9 < uVar5) {
            uVar5 = 10;
          }
          QTest::qSleep(uVar5);
        }
        cVar1 = QDeadlineTimer::hasExpired();
      } while (cVar1 == '\0');
      pQVar2 = QWidget::window(widget);
      pQVar4 = QWidget::windowHandle(pQVar2);
      pQVar3 = pQVar4;
      if (pQVar4 != (QWindow *)0x0) {
        pQVar3 = (QWindow *)QWindow::isExposed();
      }
      bVar6 = (bool)(pQVar4 != (QWindow *)0x0 & (byte)pQVar3);
    }
  }
LAB_002f4fd3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

Q_WIDGETS_EXPORT bool QTest::qWaitForWindowExposed(QWidget *widget, int timeout)
{
    return qWaitForWidgetWindow([&]() { return widget->window()->windowHandle(); },
                                [&](QWindow *window) { return window->isExposed(); },
                                timeout);
}